

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeymapper.cpp
# Opt level: O3

void * __thiscall QKeyMapper::resolveInterface(QKeyMapper *this,char *name,int revision)

{
  QDebug this_00;
  int iVar1;
  long lVar2;
  void *pvVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QDebug local_60;
  char local_58 [24];
  undefined8 local_40;
  QArrayData *local_38 [3];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = QtPrivateLogging::lcNativeInterface();
  if ((*(byte *)(lVar2 + 0x10) & 1) != 0) {
    local_40 = *(undefined8 *)(lVar2 + 8);
    local_58[0] = '\x02';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    QMessageLogger::debug
              (local_58,"Comparing requested interface name %s with available %s",name,
               "QEvdevKeyMapper");
  }
  iVar1 = qstrcmp(name,"QEvdevKeyMapper");
  lVar2 = QtPrivateLogging::lcNativeInterface();
  if (iVar1 == 0) {
    if ((*(byte *)(lVar2 + 0x10) & 1) != 0) {
      local_40 = *(undefined8 *)(lVar2 + 8);
      local_58[0] = '\x02';
      local_58[1] = '\0';
      local_58[2] = '\0';
      local_58[3] = '\0';
      local_58[4] = '\0';
      local_58[5] = '\0';
      local_58[6] = '\0';
      local_58[7] = '\0';
      local_58[8] = '\0';
      local_58[9] = '\0';
      local_58[10] = '\0';
      local_58[0xb] = '\0';
      local_58[0xc] = '\0';
      local_58[0xd] = '\0';
      local_58[0xe] = '\0';
      local_58[0xf] = '\0';
      local_58[0x10] = '\0';
      local_58[0x11] = '\0';
      local_58[0x12] = '\0';
      local_58[0x13] = '\0';
      local_58[0x14] = '\0';
      local_58[0x15] = '\0';
      local_58[0x16] = '\0';
      local_58[0x17] = '\0';
      QMessageLogger::debug
                (local_58,
                 "Match for interface %s. Comparing revisions (requested %d / available %d)",name,
                 (ulong)(uint)revision,1);
    }
    lVar2 = QtPrivateLogging::lcNativeInterface();
    if (revision == 1) {
      if ((*(byte *)(lVar2 + 0x10) & 1) != 0) {
        local_40 = *(undefined8 *)(lVar2 + 8);
        local_58[0] = '\x02';
        local_58[1] = '\0';
        local_58[2] = '\0';
        local_58[3] = '\0';
        local_58[4] = '\0';
        local_58[5] = '\0';
        local_58[6] = '\0';
        local_58[7] = '\0';
        local_58[8] = '\0';
        local_58[9] = '\0';
        local_58[10] = '\0';
        local_58[0xb] = '\0';
        local_58[0xc] = '\0';
        local_58[0xd] = '\0';
        local_58[0xe] = '\0';
        local_58[0xf] = '\0';
        local_58[0x10] = '\0';
        local_58[0x11] = '\0';
        local_58[0x12] = '\0';
        local_58[0x13] = '\0';
        local_58[0x14] = '\0';
        local_58[0x15] = '\0';
        local_58[0x16] = '\0';
        local_58[0x17] = '\0';
        QMessageLogger::debug();
        this_00.stream = local_60.stream;
        QVar4.m_data = (storage_type *)0x25;
        QVar4.m_size = (qsizetype)local_38;
        QString::fromUtf8(QVar4);
        QTextStream::operator<<(&(this_00.stream)->ts,(QString *)local_38);
        if (local_38[0] != (QArrayData *)0x0) {
          LOCK();
          (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_38[0],2,0x10);
          }
        }
        if ((local_60.stream)->space == true) {
          QTextStream::operator<<(&(local_60.stream)->ts,' ');
        }
        QTextStream::operator<<(&(local_60.stream)->ts,QGuiApplicationPrivate::platform_integration)
        ;
        if ((local_60.stream)->space == true) {
          QTextStream::operator<<(&(local_60.stream)->ts,' ');
        }
        QDebug::~QDebug(&local_60);
      }
      if (QGuiApplicationPrivate::platform_integration != (QPlatformIntegration *)0x0) {
        pvVar3 = (void *)__dynamic_cast(QGuiApplicationPrivate::platform_integration,
                                        &QPlatformIntegration::typeinfo,
                                        &QNativeInterface::Private::QEvdevKeyMapper::typeinfo,
                                        0xfffffffffffffffe);
        goto LAB_002ecbaf;
      }
    }
    else if ((*(byte *)(lVar2 + 0x11) & 1) != 0) {
      local_40 = *(undefined8 *)(lVar2 + 8);
      local_58[0] = '\x02';
      local_58[1] = '\0';
      local_58[2] = '\0';
      local_58[3] = '\0';
      local_58[4] = '\0';
      local_58[5] = '\0';
      local_58[6] = '\0';
      local_58[7] = '\0';
      local_58[8] = '\0';
      local_58[9] = '\0';
      local_58[10] = '\0';
      local_58[0xb] = '\0';
      local_58[0xc] = '\0';
      local_58[0xd] = '\0';
      local_58[0xe] = '\0';
      local_58[0xf] = '\0';
      local_58[0x10] = '\0';
      local_58[0x11] = '\0';
      local_58[0x12] = '\0';
      local_58[0x13] = '\0';
      local_58[0x14] = '\0';
      local_58[0x15] = '\0';
      local_58[0x16] = '\0';
      local_58[0x17] = '\0';
      pvVar3 = (void *)0x0;
      QMessageLogger::warning
                (local_58,
                 "Native interface revision mismatch (requested %d / available %d) for interface %s"
                 ,(ulong)(uint)revision,1,name);
      goto LAB_002ecbaf;
    }
  }
  else if ((*(byte *)(lVar2 + 0x10) & 1) != 0) {
    local_40 = *(undefined8 *)(lVar2 + 8);
    local_58[0] = '\x02';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    pvVar3 = (void *)0x0;
    QMessageLogger::debug(local_58,"No match for requested interface name %s",name);
    goto LAB_002ecbaf;
  }
  pvVar3 = (void *)0x0;
LAB_002ecbaf:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pvVar3;
  }
  __stack_chk_fail();
}

Assistant:

void *QKeyMapper::resolveInterface(const char *name, int revision) const
{
    Q_UNUSED(name); Q_UNUSED(revision);
    using namespace QNativeInterface::Private;

#if QT_CONFIG(evdev)
    QT_NATIVE_INTERFACE_RETURN_IF(QEvdevKeyMapper, QGuiApplicationPrivate::platformIntegration());
#endif

#if QT_CONFIG(vxworksevdev)
    QT_NATIVE_INTERFACE_RETURN_IF(QVxKeyMapper, QGuiApplicationPrivate::platformIntegration());
#endif

    return nullptr;
}